

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall Model_containsComponent_Test::TestBody(Model_containsComponent_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  ModelPtr m;
  ComponentPtr c2;
  ComponentPtr c1;
  long *local_80;
  AssertionResult local_78;
  long local_68 [2];
  AssertHelper local_58 [8];
  byte local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Component::create();
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"child1","");
  libcellml::NamedEntity::setName(local_20);
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"child2","");
  libcellml::NamedEntity::setName(local_30);
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  psVar1 = local_40;
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"child1","");
  local_50[0] = libcellml::ComponentEntity::containsComponent(psVar1,SUB81(&local_78,0));
  local_50[0] = local_50[0] ^ 1;
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  if (local_50[0] == 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(char *)local_50,"m->containsComponent(\"child1\")","true");
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,200,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,local_68[0] + 1);
    }
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_40);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_40);
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"child2","");
  local_50[0] = libcellml::ComponentEntity::containsComponent(local_40,SUB81(&local_78,0));
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  if (local_50[0] == 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(char *)local_50,"m->containsComponent(\"child2\")","false");
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0xcc,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,local_68[0] + 1);
    }
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

TEST(Model, containsComponent)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    c1->setName("child1");
    c2->setName("child2");

    EXPECT_FALSE(m->containsComponent("child1"));

    m->addComponent(c1);
    m->addComponent(c2);
    EXPECT_TRUE(m->containsComponent("child2"));
}